

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufdwatch.c
# Opt level: O0

void fd_watch_thread_func(_AL_THREAD *self,void *unused)

{
  _Bool _Var1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  int *piVar5;
  uint i_1;
  WATCH_ITEM *wi_1;
  int retval;
  timeval tv;
  fd_set *__arr;
  uint __i;
  uint i;
  WATCH_ITEM *wi;
  int max_fd;
  fd_set rfds;
  _AL_THREAD *in_stack_ffffffffffffff10;
  uint local_d4;
  timeval local_c0;
  fd_set *local_b0;
  uint local_a8;
  uint local_a4;
  int *local_a0;
  int local_94;
  fd_set local_90;
  
  while (_Var1 = _al_get_thread_should_stop(in_stack_ffffffffffffff10), ((_Var1 ^ 0xffU) & 1) != 0)
  {
    _al_mutex_lock((_AL_MUTEX *)0x1fe70b);
    local_b0 = &local_90;
    for (local_a8 = 0; local_a8 < 0x10; local_a8 = local_a8 + 1) {
      local_b0->fds_bits[local_a8] = 0;
    }
    local_94 = -1;
    for (local_a4 = 0; uVar3 = (ulong)local_a4, sVar4 = _al_vector_size(&fd_watch_list),
        uVar3 < sVar4; local_a4 = local_a4 + 1) {
      local_a0 = (int *)_al_vector_ref(&fd_watch_list,local_a4);
      local_90.fds_bits[*local_a0 / 0x40] =
           1L << ((byte)((long)*local_a0 % 0x40) & 0x3f) | local_90.fds_bits[*local_a0 / 0x40];
      if (local_94 < *local_a0) {
        local_94 = *local_a0;
      }
    }
    _al_mutex_unlock((_AL_MUTEX *)0x1fe7fd);
    local_c0.tv_sec = 0;
    local_c0.tv_usec = 250000;
    iVar2 = select(local_94 + 1,&local_90,(fd_set *)0x0,(fd_set *)0x0,&local_c0);
    if (0 < iVar2) {
      _al_mutex_lock((_AL_MUTEX *)0x1fe848);
      for (local_d4 = 0; sVar4 = _al_vector_size(&fd_watch_list), local_d4 < sVar4;
          local_d4 = local_d4 + 1) {
        piVar5 = (int *)_al_vector_ref(&fd_watch_list,local_d4);
        in_stack_ffffffffffffff10 = (_AL_THREAD *)local_90.fds_bits[*piVar5 / 0x40];
        if (((ulong)in_stack_ffffffffffffff10 & 1L << ((byte)((long)*piVar5 % 0x40) & 0x3f)) != 0) {
          (**(code **)(piVar5 + 2))(*(undefined8 *)(piVar5 + 4));
        }
      }
      _al_mutex_unlock((_AL_MUTEX *)0x1fe902);
    }
  }
  return;
}

Assistant:

static void fd_watch_thread_func(_AL_THREAD *self, void *unused)
{
   (void)unused;

   while (!_al_get_thread_should_stop(self)) {

      fd_set rfds;
      int max_fd;

      /* set up max_fd and rfds */
      _al_mutex_lock(&fd_watch_mutex);
      {
         WATCH_ITEM *wi;
         unsigned int i;

         FD_ZERO(&rfds);
         max_fd = -1;

         for (i = 0; i < _al_vector_size(&fd_watch_list); i++) {
            wi = _al_vector_ref(&fd_watch_list, i);
            FD_SET(wi->fd, &rfds);
            if (wi->fd > max_fd)
               max_fd = wi->fd;
         }
      }
      _al_mutex_unlock(&fd_watch_mutex);

      /* wait for something to happen on one of the fds */
      {
         struct timeval tv;
         int retval;

         tv.tv_sec = 0;
         tv.tv_usec = 250000;

         retval = select(max_fd+1, &rfds, NULL, NULL, &tv);
         if (retval < 1)
            continue;
      }

      /* one or more of the fds has activity */
      _al_mutex_lock(&fd_watch_mutex);
      {
         WATCH_ITEM *wi;
         unsigned int i;

         for (i = 0; i < _al_vector_size(&fd_watch_list); i++) {
            wi = _al_vector_ref(&fd_watch_list, i);
            if (FD_ISSET(wi->fd, &rfds)) {
               /* The callback is allowed to modify the watch list so the mutex
                * must be recursive.
                */
               wi->callback(wi->cb_data);
            }
         }
      }
      _al_mutex_unlock(&fd_watch_mutex);
   }
}